

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O3

_Bool ssh_ntru_client_getkey(ecdh_key *dh,ptrlen remoteKey,BinarySink *bs)

{
  _func_ecdh_key_ptr_ssh_kex_ptr__Bool *p_Var1;
  BinarySink *bs_00;
  char cVar2;
  uint8_t val;
  uint ok;
  uint16_t *ct;
  ssh_hash *psVar3;
  uint16_t *plaintext;
  strbuf *buf_o;
  mp_int *x;
  size_t i;
  long lVar4;
  size_t byte;
  bool bVar5;
  ptrlen pVar6;
  ptrlen confirmation_hash_00;
  ptrlen pVar7;
  ptrlen confirmation_hash;
  uint8_t hashdata [64];
  BinarySource src_1 [1];
  BinarySource src [1];
  uint8_t local_c8 [64];
  BinarySource local_88;
  BinarySource local_58;
  
  local_58.len = remoteKey.len;
  local_58.data = remoteKey.ptr;
  local_58.pos = 0;
  local_58.err = BSE_NO_ERROR;
  local_58.binarysource_ = &local_58;
  ct = (uint16_t *)safemalloc(0x2f9,2,0);
  pVar6 = ntru_decode_ciphertext(ct,(NTRUKeyPair *)dh[-2].vt,&local_58);
  confirmation_hash_00 = BinarySource_get_data(local_58.binarysource_,0x20);
  pVar7 = BinarySource_get_data(local_58.binarysource_,0x20);
  if (((local_58.binarysource_)->err == BSE_NO_ERROR) &&
     ((local_58.binarysource_)->len == (local_58.binarysource_)->pos)) {
    psVar3 = sha512_select(&ssh_sha512);
    if (psVar3 != (ssh_hash *)0x0) {
      (*psVar3->vt->reset)(psVar3);
    }
    lVar4 = 0;
    plaintext = (uint16_t *)safemalloc(0x2f9,2,0);
    ntru_decrypt(plaintext,ct,(NTRUKeyPair *)dh[-2].vt);
    ntru_confirmation_hash(local_c8,plaintext,(uint16_t *)(dh[-2].vt)->getpublic,0x2f9,0x11ef);
    ok = smemeq(local_c8,confirmation_hash_00.ptr,0x20);
    p_Var1 = dh[-2].vt[1].new;
    do {
      plaintext[lVar4] =
           (*(ushort *)(p_Var1 + lVar4 * 2) ^ plaintext[lVar4]) & (short)ok - 1U ^ plaintext[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x2f9);
    ntru_session_hash(local_c8,ok,plaintext,0x2f9,pVar6,confirmation_hash_00);
    smemclr(plaintext,0x5f2);
    safefree(plaintext);
    smemclr(ct,0x5f2);
    safefree(ct);
    BinarySink_put_data(psVar3->binarysink_,local_c8,0x20);
    buf_o = strbuf_new_nm();
    cVar2 = (**(code **)((dh[-1].vt)->new + 0x18))(dh[-1].vt,pVar7.ptr,pVar7.len,buf_o->binarysink_)
    ;
    if (cVar2 == '\0') {
      (*psVar3->vt->free)(psVar3);
    }
    else {
      local_88.data = buf_o->u;
      local_88.len = buf_o->len;
      local_88.binarysource_ = &local_88;
      local_88.pos = 0;
      local_88.err = BSE_NO_ERROR;
      x = BinarySource_get_mp_ssh2(local_88.binarysource_);
      byte = 0x1f;
      do {
        bs_00 = psVar3->binarysink_;
        val = mp_get_byte(x,byte);
        BinarySink_put_byte(bs_00,val);
        bVar5 = byte != 0;
        byte = byte - 1;
      } while (bVar5);
      mp_free(x);
      strbuf_free(buf_o);
      (*psVar3->vt->digest)(psVar3,local_c8);
      (*psVar3->vt->free)(psVar3);
      pVar6.len = 0x40;
      pVar6.ptr = local_c8;
      BinarySink_put_stringpl(bs->binarysink_,pVar6);
    }
    smemclr(local_c8,0x40);
  }
  else {
    smemclr(ct,0x5f2);
    safefree(ct);
    cVar2 = '\0';
  }
  return (_Bool)cVar2;
}

Assistant:

static bool ssh_ntru_client_getkey(ecdh_key *dh, ptrlen remoteKey,
                                   BinarySink *bs)
{
    ntru_client_key *nk = container_of(dh, ntru_client_key, ek);

    /*
     * We expect the server to have sent us a string containing a
     * ciphertext, a confirmation hash, and a Curve25519 public point.
     * Extract all three.
     */
    BinarySource src[1];
    BinarySource_BARE_INIT_PL(src, remoteKey);

    uint16_t *ciphertext = snewn(p_LIVE, uint16_t);
    ptrlen ciphertext_encoded = ntru_decode_ciphertext(
        ciphertext, nk->keypair, src);
    ptrlen confirmation_hash = get_data(src, 32);
    ptrlen curve25519_remoteKey = get_data(src, 32);

    if (get_err(src) || get_avail(src)) {
        /* Hard-fail if the input wasn't exactly the right length */
        ring_free(ciphertext, p_LIVE);
        return false;
    }

    /*
     * Main hash object which will combine the NTRU and Curve25519
     * outputs.
     */
    ssh_hash *h = ssh_hash_new(&ssh_sha512);

    /* Reusable buffer for storing various hash outputs. */
    uint8_t hashdata[64];

    /*
     * NTRU side.
     */
    {
        /* Decrypt the ciphertext to recover the server's plaintext */
        uint16_t *plaintext = snewn(p_LIVE, uint16_t);
        ntru_decrypt(plaintext, ciphertext, nk->keypair);

        /* Make the confirmation hash */
        ntru_confirmation_hash(hashdata, plaintext, nk->keypair->h,
                               p_LIVE, q_LIVE);

        /* Check it matches the one the server sent */
        unsigned ok = smemeq(hashdata, confirmation_hash.ptr, 32);

        /* If not, substitute in rho for the plaintext in the session hash */
        unsigned mask = ok-1;
        for (size_t i = 0; i < p_LIVE; i++)
            plaintext[i] ^= mask & (plaintext[i] ^ nk->keypair->rho[i]);

        /* Compute the session hash, whether or not we did that */
        ntru_session_hash(hashdata, ok, plaintext, p_LIVE, ciphertext_encoded,
                          confirmation_hash);

        /* Free temporary values */
        ring_free(plaintext, p_LIVE);
        ring_free(ciphertext, p_LIVE);

        /* And put the NTRU session hash into the main hash object. */
        put_data(h, hashdata, 32);
    }

    /*
     * Curve25519 side.
     */
    {
        strbuf *otherkey = strbuf_new_nm();

        /* Call out to Curve25519 to compute the shared secret from that
         * kex method */
        bool ok = ecdh_key_getkey(nk->curve25519, curve25519_remoteKey,
                                  BinarySink_UPCAST(otherkey));

        /* If that failed (which only happens if the other end does
         * something wrong, like sending a low-order curve point
         * outside the subgroup it's supposed to), we might as well
         * just abort and return failure. That's what we'd have done
         * in standalone Curve25519. */
        if (!ok) {
            ssh_hash_free(h);
            smemclr(hashdata, sizeof(hashdata));
            return false;
        }

        /*
         * ecdh_key_getkey will have returned us a chunk of data
         * containing an encoded mpint, which is how the Curve25519
         * output normally goes into the exchange hash. But in this
         * context we want to treat it as a fixed big-endian 32 bytes,
         * so extract it from its encoding and put it into the main
         * hash object in the new format.
         */
        BinarySource src[1];
        BinarySource_BARE_INIT_PL(src, ptrlen_from_strbuf(otherkey));
        mp_int *curvekey = get_mp_ssh2(src);

        for (unsigned i = 32; i-- > 0 ;)
            put_byte(h, mp_get_byte(curvekey, i));

        mp_free(curvekey);
        strbuf_free(otherkey);
    }

    /*
     * Finish up: compute the final output hash (full 64 bytes of
     * SHA-512 this time), and return it encoded as a string.
     */
    ssh_hash_final(h, hashdata);
    put_stringpl(bs, make_ptrlen(hashdata, sizeof(hashdata)));
    smemclr(hashdata, sizeof(hashdata));

    return true;
}